

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImFontAtlas::RenderCustomTexData(ImFontAtlas *this,int pass,void *p_rects)

{
  float *pfVar1;
  char cVar2;
  ushort uVar3;
  float fVar4;
  long lVar5;
  ImGuiContext *pIVar6;
  void *__dest;
  int y;
  int iVar7;
  int iVar8;
  undefined8 *puVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  ImVec2 cursor_datas [7] [3];
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  if (pass == 1) {
    if (*p_rects < 1) {
      __assert_fail("i < Size",
                    "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.h"
                    ,0x35b,"value_type &ImVector<stbrp_rect>::operator[](int) [T = stbrp_rect]");
    }
    lVar5 = *(long *)((long)p_rects + 8);
    iVar8 = 0;
    lVar10 = 0;
    do {
      lVar12 = 0;
      do {
        cVar2 = "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....XX           -  X.X  - X.....X -        X.....X        -X...X            -            X...XXX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..XX.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.XX..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XXX...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        X......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         X.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          X........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           X.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            X..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           X......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          X...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       ------------------------------------X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           XX    X..X  -       - X.....X -        X.....X        -   X.X           X.X   -                 X..X          -  X...X  -         X...X         -  X..X           X..X  -                  XX           -   X.X   -          X.X          - X...XXXXXXXXXXXXX...X -           ------------        -    X    -           X           -X..............." /* TRUNCATED STRING LITERAL */
                [(int)lVar10 + lVar12];
        lVar13 = (long)(int)((uint)*(ushort *)(lVar5 + 8) + (int)lVar12 +
                            ((uint)*(ushort *)(lVar5 + 10) + iVar8) * this->TexWidth);
        this->TexPixelsAlpha8[lVar13] = -(cVar2 == '.');
        this->TexPixelsAlpha8[lVar13 + 0x5b] = -(cVar2 == 'X');
        lVar12 = lVar12 + 1;
      } while ((int)lVar12 != 0x5a);
      iVar8 = iVar8 + 1;
      lVar10 = (int)lVar10 + lVar12;
    } while (iVar8 != 0x1b);
    fVar15 = 1.0 / (float)this->TexWidth;
    fVar14 = 1.0 / (float)this->TexHeight;
    uVar3 = *(ushort *)(lVar5 + 10);
    (this->TexUvWhitePixel).x = ((float)*(ushort *)(lVar5 + 8) + 0.5) * fVar15;
    (this->TexUvWhitePixel).y = ((float)uVar3 + 0.5) * fVar14;
    puVar9 = &local_b8;
    local_b8 = 0;
    uStack_b0 = 0x41500000;
    local_a8 = 0x4180000040e00000;
    uStack_a0 = 0x4100000040800000;
    local_98 = 0x41f80000;
    uStack_90 = 0x41b8000041b80000;
    local_88 = 0x4130000041300000;
    uStack_80 = 0x41a80000;
    local_78 = 0x41b8000041100000;
    uStack_70 = 0x4130000040a00000;
    local_68 = 0x41900000425c0000;
    uStack_60 = 0x4110000041b80000;
    local_58 = 0x40a0000041300000;
    uStack_50 = 0x42920000;
    local_48 = 0x4188000041880000;
    uStack_40 = 0x4110000041100000;
    local_38 = 0x425c0000;
    uStack_30 = 0x4188000041880000;
    local_28 = 0x4110000041100000;
    lVar10 = 0x197c;
    lVar12 = 0;
    do {
      pIVar6 = GImGui;
      fVar16 = (float)*(ushort *)(lVar5 + 8) + *(float *)(puVar9 + -2);
      fVar18 = (float)*(ushort *)(lVar5 + 10) + *(float *)((long)puVar9 + -0xc);
      fVar4 = *(float *)(puVar9 + -1);
      fVar17 = *(float *)((long)puVar9 + -4);
      *(int *)((long)(GImGui->IO).KeyMap + lVar10 + -0x34) = (int)lVar12;
      *(float *)((long)(pIVar6->IO).KeyMap + lVar10 + -0x28) = fVar4;
      *(float *)((long)(pIVar6->IO).KeyMap + lVar10 + -0x24) = fVar17;
      *(undefined8 *)((long)(pIVar6->IO).KeyMap + lVar10 + -0x30) = *puVar9;
      fVar19 = fVar14 * fVar18;
      pfVar1 = (float *)((long)(pIVar6->IO).KeyMap + lVar10 + -0x20);
      *pfVar1 = fVar15 * fVar16;
      pfVar1[1] = fVar19;
      pfVar1[2] = fVar15 * (fVar16 + 91.0);
      pfVar1[3] = fVar19;
      fVar17 = (fVar17 + fVar18) * fVar14;
      pfVar1 = (float *)((long)(pIVar6->IO).KeyMap + lVar10 + -0x10);
      *pfVar1 = (fVar16 + fVar4) * fVar15;
      pfVar1[1] = fVar17;
      pfVar1[2] = (fVar16 + 91.0 + fVar4) * fVar15;
      pfVar1[3] = fVar17;
      lVar12 = lVar12 + 1;
      puVar9 = puVar9 + 3;
      lVar10 = lVar10 + 0x34;
    } while (lVar12 != 7);
  }
  else if (pass == 0) {
    iVar8 = *(int *)((long)p_rects + 4);
    if (*p_rects == iVar8) {
      iVar11 = *p_rects + 1;
      if (iVar8 == 0) {
        iVar7 = 8;
      }
      else {
        iVar7 = iVar8 / 2 + iVar8;
      }
      if (iVar11 < iVar7) {
        iVar11 = iVar7;
      }
      if (iVar8 < iVar11) {
        __dest = ImGui::MemAlloc((long)iVar11 << 4);
        if (*(void **)((long)p_rects + 8) != (void *)0x0) {
          memcpy(__dest,*(void **)((long)p_rects + 8),(long)*p_rects << 4);
        }
        ImGui::MemFree(*(void **)((long)p_rects + 8));
        *(void **)((long)p_rects + 8) = __dest;
        *(int *)((long)p_rects + 4) = iVar11;
      }
    }
    lVar5 = *(long *)((long)p_rects + 8);
    iVar8 = *p_rects;
    *(int *)p_rects = iVar8 + 1;
    lVar10 = (long)iVar8 * 0x10;
    *(undefined8 *)(lVar5 + lVar10) = 0x1c00b500000000;
    *(undefined8 *)(lVar5 + 8 + lVar10) = 0;
  }
  return;
}

Assistant:

void ImFontAtlas::RenderCustomTexData(int pass, void* p_rects)
{
    // A work of art lies ahead! (. = white layer, X = black layer, others are blank)
    // The white texels on the top left are the ones we'll use everywhere in ImGui to render filled shapes.
    const int TEX_DATA_W = 90;
    const int TEX_DATA_H = 27;
    const char texture_data[TEX_DATA_W*TEX_DATA_H+1] =
    {
        "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX"
        "..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X"
        "---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X"
        "X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X"
        "XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X"
        "X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X"
        "X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX"
        "X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      "
        "X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       "
        "X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        "
        "X......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         "
        "X.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          "
        "X........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           "
        "X.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            "
        "X..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           "
        "X......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          "
        "X...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          "
        "X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       ------------------------------------"
        "X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           "
        "XX    X..X  -       - X.....X -        X.....X        -   X.X           X.X   -           "
        "      X..X          -  X...X  -         X...X         -  X..X           X..X  -           "
        "       XX           -   X.X   -          X.X          - X...XXXXXXXXXXXXX...X -           "
        "------------        -    X    -           X           -X.....................X-           "
        "                    ----------------------------------- X...XXXXXXXXXXXXX...X -           "
        "                                                      -  X..X           X..X  -           "
        "                                                      -   X.X           X.X   -           "
        "                                                      -    XX           XX    -           "
    };

    ImVector<stbrp_rect>& rects = *(ImVector<stbrp_rect>*)p_rects;
    if (pass == 0)
    {
        // Request rectangles
        stbrp_rect r;
        memset(&r, 0, sizeof(r));
        r.w = (TEX_DATA_W*2)+1;
        r.h = TEX_DATA_H+1;
        rects.push_back(r);
    }
    else if (pass == 1)
    {
        // Render/copy pixels
        const stbrp_rect& r = rects[0];
        for (int y = 0, n = 0; y < TEX_DATA_H; y++)
            for (int x = 0; x < TEX_DATA_W; x++, n++)
            {
                const int offset0 = (int)(r.x + x) + (int)(r.y + y) * TexWidth;
                const int offset1 = offset0 + 1 + TEX_DATA_W;
                TexPixelsAlpha8[offset0] = texture_data[n] == '.' ? 0xFF : 0x00;
                TexPixelsAlpha8[offset1] = texture_data[n] == 'X' ? 0xFF : 0x00;
            }
        const ImVec2 tex_uv_scale(1.0f / TexWidth, 1.0f / TexHeight);
        TexUvWhitePixel = ImVec2((r.x + 0.5f) * tex_uv_scale.x, (r.y + 0.5f) * tex_uv_scale.y);

        // Setup mouse cursors
        const ImVec2 cursor_datas[ImGuiMouseCursor_Count_][3] =
        {
            // Pos ........ Size ......... Offset ......
            { ImVec2(0,3),  ImVec2(12,19), ImVec2( 0, 0) }, // ImGuiMouseCursor_Arrow
            { ImVec2(13,0), ImVec2(7,16),  ImVec2( 4, 8) }, // ImGuiMouseCursor_TextInput
            { ImVec2(31,0), ImVec2(23,23), ImVec2(11,11) }, // ImGuiMouseCursor_Move
            { ImVec2(21,0), ImVec2( 9,23), ImVec2( 5,11) }, // ImGuiMouseCursor_ResizeNS
            { ImVec2(55,18),ImVec2(23, 9), ImVec2(11, 5) }, // ImGuiMouseCursor_ResizeEW
            { ImVec2(73,0), ImVec2(17,17), ImVec2( 9, 9) }, // ImGuiMouseCursor_ResizeNESW
            { ImVec2(55,0), ImVec2(17,17), ImVec2( 9, 9) }, // ImGuiMouseCursor_ResizeNWSE
        };

        for (int type = 0; type < ImGuiMouseCursor_Count_; type++)
        {
            ImGuiMouseCursorData& cursor_data = GImGui->MouseCursorData[type];
            ImVec2 pos = cursor_datas[type][0] + ImVec2((float)r.x, (float)r.y);
            const ImVec2 size = cursor_datas[type][1];
            cursor_data.Type = type;
            cursor_data.Size = size;
            cursor_data.HotOffset = cursor_datas[type][2];
            cursor_data.TexUvMin[0] = (pos) * tex_uv_scale;
            cursor_data.TexUvMax[0] = (pos + size) * tex_uv_scale;
            pos.x += TEX_DATA_W+1;
            cursor_data.TexUvMin[1] = (pos) * tex_uv_scale;
            cursor_data.TexUvMax[1] = (pos + size) * tex_uv_scale;
        }
    }
}